

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20240722::Cord::Cord(Cord *this,string_view src,MethodIdentifier method)

{
  Nullable<CordRep_*> rep;
  Nullable<const_char_*> data;
  ulong length;
  
  data = src._M_str;
  length = src._M_len;
  if (length < 0x10) {
    cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
    return;
  }
  rep = NewTree(data,length,(size_t)data);
  InlineRep::EmplaceTree(&this->contents_,rep,method);
  return;
}

Assistant:

Cord::Cord(absl::string_view src, MethodIdentifier method)
    : contents_(InlineData::kDefaultInit) {
  const size_t n = src.size();
  if (n <= InlineRep::kMaxInline) {
    contents_.set_data(src.data(), n);
  } else {
    CordRep* rep = NewTree(src.data(), n, 0);
    contents_.EmplaceTree(rep, method);
  }
}